

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BufferStartCase::iterate(BufferStartCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLenum GVar2;
  deBool dVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  TestError *this_01;
  GLuint index;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  ScopedLogSection local_2b0;
  ScopedLogSection section_4;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  ScopedLogSection local_258;
  ScopedLogSection section_3;
  string local_248;
  allocator<char> local_221;
  string local_220;
  ScopedLogSection local_200;
  ScopedLogSection section_2;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  ScopedLogSection local_1a8;
  ScopedLogSection section_1;
  int offset;
  int ndxB;
  int ndxA;
  Buffer bufferB;
  Buffer bufferA;
  string local_158;
  allocator<char> local_131;
  string local_130;
  ScopedLogSection local_110;
  ScopedLogSection superSection;
  int ndx;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  int maxBindings;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  BufferStartCase *this_local;
  
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar6);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar6,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  section.m_log._0_4_ = -1;
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  glu::CallLogWrapper::glGetIntegerv(this_00,this->m_numBindingsTarget,(GLint *)&section);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(GVar2,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x13c);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Initial",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Initial value",(allocator<char> *)((long)&superSection.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar6,&local_d8,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&superSection.m_log + 7));
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  for (superSection.m_log._0_4_ = 0; (int)superSection.m_log < (int)section.m_log;
      superSection.m_log._0_4_ = (int)superSection.m_log + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               this->m_queryTarget,(int)superSection.m_log,0,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"AfterSetting",&local_131)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"After setting",
             (allocator<char> *)&bufferA.super_ObjectWrapper.field_0x17);
  tcu::ScopedLogSection::ScopedLogSection(&local_110,pTVar6,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&bufferA.super_ObjectWrapper.field_0x17);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&bufferB.super_ObjectWrapper.m_object,pRVar5)
  ;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&ndxB,pRVar5);
  index = (int)section.m_log / 2;
  section_1.m_log._4_4_ = -1;
  if (this->m_bufferTarget == 0x92c0) {
    section_1.m_log._4_4_ = 4;
  }
  else if (this->m_bufferTarget == 0x90d2) {
    glu::CallLogWrapper::glGetIntegerv
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x90df,
               (GLint *)((long)&section_1.m_log + 4));
    GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8))
    ;
    glu::checkError(GVar2,"get align",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                    ,0x153);
  }
  while ((dVar3 = ::deGetFalse(), dVar3 == 0 && (-1 < section_1.m_log._4_4_))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"Generic",&local_1c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"After setting generic binding point",
                 (allocator<char> *)((long)&section_2.m_log + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_1a8,pTVar6,&local_1c8,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      GVar2 = this->m_bufferTarget;
      dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&bufferB.super_ObjectWrapper.m_object);
      glu::CallLogWrapper::glBindBuffer
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),GVar2,dVar4);
      glu::CallLogWrapper::glBufferData
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),this->m_bufferTarget,0x10,
                 (void *)0x0,0x88e9);
      GVar2 = this->m_bufferTarget;
      dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&ndxB);
      glu::CallLogWrapper::glBindBuffer
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),GVar2,dVar4);
      glu::CallLogWrapper::glBufferData
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),this->m_bufferTarget,0x20,
                 (void *)0x0,0x88e9);
      GVar2 = glu::CallLogWrapper::glGetError
                        ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      glu::checkError(GVar2,"gen bufs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                      ,0x161);
      gls::StateQueryUtil::verifyStateIndexedInteger
                ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,this->m_queryTarget,0,0,this->m_verifierType);
      tcu::ScopedLogSection::~ScopedLogSection(&local_1a8);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Indexed",&local_221);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"After setting with glBindBufferBase",
                 (allocator<char> *)((long)&section_3.m_log + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_200,pTVar6,&local_220,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_3.m_log + 7));
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      GVar2 = this->m_bufferTarget;
      dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&bufferB.super_ObjectWrapper.m_object);
      glu::CallLogWrapper::glBindBufferBase
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),GVar2,0,dVar4);
      GVar2 = glu::CallLogWrapper::glGetError
                        ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      glu::checkError(GVar2,"bind buf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                      ,0x169);
      gls::StateQueryUtil::verifyStateIndexedInteger
                ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,this->m_queryTarget,0,0,this->m_verifierType);
      tcu::ScopedLogSection::~ScopedLogSection(&local_200);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"Indexed",&local_279);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,"After setting with glBindBufferRange",
                 (allocator<char> *)((long)&section_4.m_log + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar6,&local_278,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_4.m_log + 7));
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator(&local_279);
      GVar2 = this->m_bufferTarget;
      dVar4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&ndxB);
      glu::CallLogWrapper::glBindBufferRange
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),GVar2,index,dVar4,
                 (long)section_1.m_log._4_4_,8);
      GVar2 = glu::CallLogWrapper::glGetError
                        ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      glu::checkError(GVar2,"bind buf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                      ,0x171);
      gls::StateQueryUtil::verifyStateIndexedInteger
                ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,this->m_queryTarget,index,section_1.m_log._4_4_,this->m_verifierType);
      tcu::ScopedLogSection::~ScopedLogSection(&local_258);
      if (index != 0) {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"DifferentStates",&local_2d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"Original state did not change",&local_2f9);
        tcu::ScopedLogSection::ScopedLogSection(&local_2b0,pTVar6,&local_2d0,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator(&local_2f9);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
        gls::StateQueryUtil::verifyStateIndexedInteger
                  ((ResultCollector *)local_78,
                   (CallLogWrapper *)((long)&result.m_message.field_2 + 8),this->m_queryTarget,0,0,
                   this->m_verifierType);
        tcu::ScopedLogSection::~ScopedLogSection(&local_2b0);
      }
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)&ndxB);
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)&bufferB.super_ObjectWrapper.m_object);
      tcu::ScopedLogSection::~ScopedLogSection(&local_110);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_78,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      return STOP;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"offset >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
             ,0x158);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

BufferStartCase::IterateResult BufferStartCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						maxBindings	= -1;

	gl.enableLogging(true);

	gl.glGetIntegerv(m_numBindingsTarget, &maxBindings);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxBindings; ++ndx)
			verifyStateIndexedInteger(result, gl, m_queryTarget, ndx, 0, m_verifierType);
	}


	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSetting", "After setting");
		glu::Buffer					bufferA			(m_context.getRenderContext());
		glu::Buffer					bufferB			(m_context.getRenderContext());
		const int					ndxA			= 0;
		const int					ndxB			= maxBindings / 2;
		int							offset			= -1;

		if (m_bufferTarget == GL_ATOMIC_COUNTER_BUFFER)
			offset = 4;
		else if (m_bufferTarget == GL_SHADER_STORAGE_BUFFER)
		{
			gl.glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &offset);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "get align");
		}
		else
			DE_ASSERT(false);

		TCU_CHECK(offset >= 0);

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Generic", "After setting generic binding point");

			gl.glBindBuffer(m_bufferTarget, *bufferA);
			gl.glBufferData(m_bufferTarget, 16, DE_NULL, GL_DYNAMIC_READ);
			gl.glBindBuffer(m_bufferTarget, *bufferB);
			gl.glBufferData(m_bufferTarget, 32, DE_NULL, GL_DYNAMIC_READ);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen bufs");

			verifyStateIndexedInteger(result, gl, m_queryTarget, 0, 0, m_verifierType);
		}
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Indexed", "After setting with glBindBufferBase");

			gl.glBindBufferBase(m_bufferTarget, ndxA, *bufferA);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind buf");

			verifyStateIndexedInteger(result, gl, m_queryTarget, ndxA, 0, m_verifierType);
		}
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Indexed", "After setting with glBindBufferRange");

			gl.glBindBufferRange(m_bufferTarget, ndxB, *bufferB, offset, 8);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind buf");

			verifyStateIndexedInteger(result, gl, m_queryTarget, ndxB, offset, m_verifierType);
		}
		if (ndxA != ndxB)
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "DifferentStates", "Original state did not change");

			verifyStateIndexedInteger(result, gl, m_queryTarget, ndxA, 0, m_verifierType);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}